

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall
diligent_spirv_cross::CompilerGLSL::emit_array_copy
          (CompilerGLSL *this,char *expr,uint32_t lhs_id,uint32_t rhs_id,StorageClass param_4,
          StorageClass param_5)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string lhs;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  if (expr == (char *)0x0) {
    to_expression_abi_cxx11_(&local_60,this,lhs_id,true);
    ::std::__cxx11::string::operator=((string *)&local_40,(string *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  else {
    strlen(expr);
    ::std::__cxx11::string::_M_replace((ulong)&local_40,0,(char *)0x0,(ulong)expr);
  }
  to_expression_abi_cxx11_(&local_60,this,rhs_id,true);
  statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
            (this,&local_40,(char (*) [4])0x90c1db,&local_60,(char (*) [2])0x9301ce);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool CompilerGLSL::emit_array_copy(const char *expr, uint32_t lhs_id, uint32_t rhs_id, StorageClass, StorageClass)
{
	string lhs;
	if (expr)
		lhs = expr;
	else
		lhs = to_expression(lhs_id);

	statement(lhs, " = ", to_expression(rhs_id), ";");
	return true;
}